

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
nestl::impl::list<int,_nestl::allocator<int>_>::
assign_nothrow<nestl::has_exceptions::exception_ptr_error>
          (list<int,_nestl::allocator<int>_> *this,exception_ptr_error *err,size_type n,
          const_reference val)

{
  list_node_base *plVar1;
  list_node_base *plVar2;
  long lVar3;
  bool bVar4;
  list<int,_nestl::allocator<int>_> tmp;
  const_iterator local_50 [2];
  list_node_base local_40;
  
  local_40.m_next = &local_40;
  local_40.m_prev = local_40.m_next;
  list_node_base::swap(&this->m_node,local_40.m_next);
  if (n != 0) {
    lVar3 = n - 1;
    do {
      list_const_iterator<int>::list_const_iterator(local_50,&this->m_node);
      list<int,nestl::allocator<int>>::
      emplace_nothrow<nestl::has_exceptions::exception_ptr_error,int_const&>
                ((list<int,nestl::allocator<int>> *)this,err,local_50[0],val);
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      if ((err->m_exception)._M_exception_object != (void *)0x0) break;
    } while (bVar4);
  }
  plVar2 = local_40.m_next;
  while (plVar2 != &local_40) {
    plVar1 = plVar2->m_next;
    operator_delete(plVar2);
    plVar2 = plVar1;
  }
  return;
}

Assistant:

void
list<T, A>::assign_nothrow(OperationError& err, size_type n, const_reference val) NESTL_NOEXCEPT_SPEC
{
    list tmp; tmp.swap(*this);

    while (n > 0)
    {
        push_back_nothrow(err, val);
        if (err)
        {
            return;
        }

        --n;
    }
}